

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O1

VkBool32 VulkanUtilities::anon_unknown_0::DebugMessengerCallback
                   (VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity,
                   VkDebugUtilsMessageTypeFlagsEXT messageType,
                   VkDebugUtilsMessengerCallbackDataEXT *callbackData,void *userData)

{
  ostream *poVar1;
  int iVar2;
  VkDebugUtilsObjectNameInfoEXT *pVVar3;
  VkDebugUtilsLabelEXT *pVVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  __node_base_ptr p_Var8;
  size_t sVar9;
  ostream *poVar10;
  char *pcVar11;
  uint uVar12;
  char **Args;
  char *__s;
  ulong uVar13;
  char (*in_R8) [53];
  _Hash_node_base *p_Var14;
  long lVar15;
  string _msg_1;
  stringstream debugMessage;
  string local_200;
  long *local_1e0;
  long local_1d0 [2];
  long *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  uVar12 = 2;
  if ((messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT) == 0) {
    uVar12 = messageSeverity >> 8 & 1;
  }
  if (callbackData->pMessageIdName != (Char *)0x0) {
    Diligent::HashMapStringKey::HashMapStringKey
              ((HashMapStringKey *)local_1b8,callbackData->pMessageIdName,false);
    p_Var8 = std::
             _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       ((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)(anonymous_namespace)::g_IgnoreMessages,
                        (local_1b8._8_8_ & 0x7fffffffffffffff) %
                        (ulong)(anonymous_namespace)::g_IgnoreMessages._8_8_,
                        (HashMapStringKey *)local_1b8,local_1b8._8_8_ & 0x7fffffffffffffff);
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var14 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var14 = p_Var8->_M_nxt;
    }
    if (((Char *)local_1b8._0_8_ != (Char *)0x0) && ((long)local_1b8._8_8_ < 0)) {
      operator_delete__((void *)local_1b8._0_8_);
    }
    if (p_Var14 != (_Hash_node_base *)0x0) {
      LOCK();
      p_Var14 = p_Var14 + 3;
      iVar2 = *(int *)&p_Var14->_M_nxt;
      *(int *)&p_Var14->_M_nxt = *(int *)&p_Var14->_M_nxt + 1;
      UNLOCK();
      if ((messageSeverity >> 0xc & 1) == 0) {
        return 0;
      }
      if (iVar2 != 0) {
        return 0;
      }
      Diligent::FormatString<char[26],char_const*,char[53]>
                ((string *)local_1b8,(Diligent *)"Vulkan Validation error \'",
                 (char (*) [26])&callbackData->pMessageIdName,
                 (char **)"\' is being ignored. This may obfuscate a real issue.",in_R8);
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        (*(code *)Diligent::DebugMessageCallback)(1,local_1b8._0_8_,0,0,0);
      }
      if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
        return 0;
      }
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
      return 0;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar1 = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Vulkan debug message (",0x16);
  if (((messageType & 1) != 0) &&
     (std::__ostream_insert<char,std::char_traits<char>>(poVar1,"general",7), (messageType & 6) != 0
     )) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  }
  if (((messageType & 2) != 0) &&
     (std::__ostream_insert<char,std::char_traits<char>>(poVar1,"validation",10),
     (messageType & 4) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  }
  if ((messageType & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"performance",0xb);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  pcVar11 = callbackData->pMessageIdName;
  __s = "<Unknown name>";
  if (pcVar11 != (char *)0x0) {
    __s = pcVar11;
  }
  sVar9 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar9);
  cVar7 = (char)poVar1;
  if (callbackData->pMessage != (char *)0x0) {
    std::ios::widen((char)*(undefined8 *)(local_1a8._M_allocated_capacity - 0x18) + cVar7);
    std::ostream::put(cVar7);
    poVar10 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"                 ",0x11);
    pcVar11 = callbackData->pMessage;
    if (pcVar11 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar11,sVar9);
    }
  }
  if ((callbackData->objectCount != 0) && (callbackData->objectCount != 0)) {
    lVar15 = 0x20;
    uVar13 = 0;
    do {
      pVVar3 = callbackData->pObjects;
      std::ios::widen((char)*(undefined8 *)(local_1a8._M_allocated_capacity - 0x18) + cVar7);
      std::ostream::put(cVar7);
      poVar10 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"                 Object[",0x18);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] (",3);
      pcVar11 = VkObjectTypeToString(*(VkObjectType *)((long)pVVar3 + lVar15 + -0x10));
      sVar9 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar11,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"): Handle ",10);
      *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
           *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"0x",2);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      if (*(long *)((long)&pVVar3->sType + lVar15) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", Name: \'",9);
        pcVar11 = *(char **)((long)&pVVar3->sType + lVar15);
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1a8._M_allocated_capacity - 0x18)
                         );
        }
        else {
          sVar9 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar11,sVar9);
        }
        local_200._M_dataplus._M_p._0_1_ = 0x27;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_200,1);
      }
      uVar13 = uVar13 + 1;
      lVar15 = lVar15 + 0x28;
    } while (uVar13 < callbackData->objectCount);
  }
  if ((callbackData->cmdBufLabelCount != 0) && (callbackData->cmdBufLabelCount != 0)) {
    lVar15 = 0x10;
    uVar13 = 0;
    do {
      pVVar4 = callbackData->pCmdBufLabels;
      std::ios::widen((char)*(undefined8 *)(local_1a8._M_allocated_capacity - 0x18) + cVar7);
      std::ostream::put(cVar7);
      poVar10 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"                 Label[",0x17);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
      if (*(long *)((long)pVVar4->color + lVar15 + -0x18) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," - ",3);
        pcVar11 = *(char **)((long)pVVar4->color + lVar15 + -0x18);
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1a8._M_allocated_capacity - 0x18)
                         );
        }
        else {
          sVar9 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar11,sVar9);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," {",2);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
           0xfffffefb | 4;
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) = 4;
      poVar10 = std::ostream::_M_insert<double>
                          ((double)*(float *)((long)pVVar4->color + lVar15 + -0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      lVar5 = *(long *)poVar10;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar10 + lVar6 + 0x18) = *(uint *)(poVar10 + lVar6 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar10 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
      poVar10 = std::ostream::_M_insert<double>
                          ((double)*(float *)((long)pVVar4->color + lVar15 + -0xc));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      lVar5 = *(long *)poVar10;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar10 + lVar6 + 0x18) = *(uint *)(poVar10 + lVar6 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar10 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
      poVar10 = std::ostream::_M_insert<double>
                          ((double)*(float *)((long)pVVar4->color + lVar15 + -8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      lVar5 = *(long *)poVar10;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar10 + lVar6 + 0x18) = *(uint *)(poVar10 + lVar6 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar10 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
      poVar10 = std::ostream::_M_insert<double>
                          ((double)*(float *)((long)pVVar4->color + lVar15 + -4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
      uVar13 = uVar13 + 1;
      lVar15 = lVar15 + 0x28;
    } while (uVar13 < callbackData->cmdBufLabelCount);
  }
  std::__cxx11::stringbuf::str();
  local_1c0 = local_1e0;
  Diligent::FormatString<char_const*>(&local_200,(Diligent *)&local_1c0,Args);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    (*(code *)Diligent::DebugMessageCallback)
              (uVar12,CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_),0,
               0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_) !=
      &local_200.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_),
                    local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return 0;
}

Assistant:

VKAPI_ATTR VkBool32 VKAPI_CALL DebugMessengerCallback(VkDebugUtilsMessageSeverityFlagBitsEXT      messageSeverity,
                                                      VkDebugUtilsMessageTypeFlagsEXT             messageType,
                                                      const VkDebugUtilsMessengerCallbackDataEXT* callbackData,
                                                      void*                                       userData)
{
    auto MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    if (messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT)
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_ERROR;
    }
    else if (messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT)
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_WARNING;
    }
    else if (messageSeverity & (VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT))
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    }
    else
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    }

    if (callbackData->pMessageIdName != nullptr)
    {
        auto it = g_IgnoreMessages.find(callbackData->pMessageIdName);
        if (it != g_IgnoreMessages.end())
        {
            const auto PrevMsgCount = it->second.fetch_add(1);
            if (MsgSeverity == DEBUG_MESSAGE_SEVERITY_ERROR && PrevMsgCount == 0)
            {
                LOG_WARNING_MESSAGE("Vulkan Validation error '", callbackData->pMessageIdName, "' is being ignored. This may obfuscate a real issue.");
            }
            return VK_FALSE;
        }
    }

    std::stringstream debugMessage;
    debugMessage << "Vulkan debug message (";
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT)
    {
        debugMessage << "general";
        if (messageType & (VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT))
            debugMessage << ", ";
    }
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT)
    {
        debugMessage << "validation";
        if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT)
            debugMessage << ", ";
    }
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT)
        debugMessage << "performance";
    debugMessage << "): ";

    // callbackData->messageIdNumber is deprecated and starting with version 1.1.85 it is always 0
    debugMessage << (callbackData->pMessageIdName != nullptr ? callbackData->pMessageIdName : "<Unknown name>");
    if (callbackData->pMessage != nullptr)
    {
        debugMessage << std::endl
                     << "                 " << callbackData->pMessage;
    }

    if (callbackData->objectCount > 0)
    {
        for (uint32_t obj = 0; obj < callbackData->objectCount; ++obj)
        {
            const auto& Object = callbackData->pObjects[obj];
            debugMessage << std::endl
                         << "                 Object[" << obj << "] (" << VkObjectTypeToString(Object.objectType)
                         << "): Handle " << std::hex << "0x" << Object.objectHandle;
            if (Object.pObjectName != nullptr)
            {
                debugMessage << ", Name: '" << Object.pObjectName << '\'';
            }
        }
    }

    if (callbackData->cmdBufLabelCount > 0)
    {
        for (uint32_t l = 0; l < callbackData->cmdBufLabelCount; ++l)
        {
            const auto& Label = callbackData->pCmdBufLabels[l];
            debugMessage << std::endl
                         << "                 Label[" << l << "]";
            if (Label.pLabelName != nullptr)
            {
                debugMessage << " - " << Label.pLabelName;
            }
            debugMessage << " {";
            debugMessage << std::fixed << std::setw(4) << Label.color[0] << ", "
                         << std::fixed << std::setw(4) << Label.color[1] << ", "
                         << std::fixed << std::setw(4) << Label.color[2] << ", "
                         << std::fixed << std::setw(4) << Label.color[3] << "}";
        }
    }

    LOG_DEBUG_MESSAGE(MsgSeverity, debugMessage.str().c_str());

    // The return value of this callback controls whether the Vulkan call that caused
    // the validation message will be aborted or not
    // We return VK_FALSE as we DON'T want Vulkan calls that cause a validation message
    // (and return a VkResult) to abort
    return VK_FALSE;
}